

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

int mz_zip_reader_locate_file_v2
              (mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags,mz_uint32 *pIndex)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  mz_zip_internal_state *pmVar4;
  void *pvVar5;
  void *pvVar6;
  bool bVar7;
  long lVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  byte *pbVar21;
  byte *pbVar22;
  byte bVar23;
  long lVar24;
  void *__s2;
  ulong uVar25;
  byte *pbVar26;
  bool bVar27;
  size_t local_78;
  
  if (pIndex != (mz_uint32 *)0x0) {
    *pIndex = 0;
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar4 = pZip->m_pState;
  if (pName == (char *)0x0 || pmVar4 == (mz_zip_internal_state *)0x0) {
LAB_00107a31:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if ((((pmVar4->m_init_flags & 0x800) == 0) && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)) &&
     (pComment == (char *)0x0 && (flags & 0x300) == 0)) {
    if ((pmVar4->m_sorted_central_dir_offsets).m_size != 0) {
      pvVar5 = (pmVar4->m_sorted_central_dir_offsets).m_p;
      uVar3 = pZip->m_total_files;
      sVar10 = strlen(pName);
      if (pIndex != (mz_uint32 *)0x0) {
        *pIndex = 0;
      }
      if ((ulong)uVar3 != 0) {
        lVar24 = (ulong)uVar3 - 1;
        pvVar6 = (pmVar4->m_central_dir).m_p;
        lVar18 = 0;
        do {
          uVar17 = (lVar24 - lVar18 >> 1) + lVar18;
          uVar3 = *(uint *)((long)pvVar5 + (uVar17 & 0xffffffff) * 4);
          uVar12 = (ulong)*(uint *)((long)(pmVar4->m_central_dir_offsets).m_p + (ulong)uVar3 * 4);
          pbVar21 = (byte *)((long)pvVar6 + uVar12 + 0x2e);
          uVar2 = *(ushort *)((long)pvVar6 + uVar12 + 0x1c);
          uVar25 = (ulong)uVar2;
          if ((uint)sVar10 <= (uint)uVar2) {
            uVar25 = sVar10 & 0xffffffff;
          }
          pbVar22 = (byte *)((long)pvVar6 + uVar25 + uVar12 + 0x2e);
          pbVar26 = (byte *)pName;
          if ((int)uVar25 == 0) {
            iVar9 = 0;
          }
          else {
            do {
              bVar1 = *pbVar21;
              bVar16 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar16 = bVar1;
              }
              bVar1 = *pbVar26;
              bVar23 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar23 = bVar1;
              }
              if (bVar16 != bVar23) break;
              pbVar21 = pbVar21 + 1;
              pbVar26 = pbVar26 + 1;
              bVar23 = bVar16;
            } while (pbVar21 < pbVar22);
            iVar9 = (uint)bVar16 - (uint)bVar23;
          }
          if (pbVar21 == pbVar22) {
            iVar9 = (uint)uVar2 - (uint)sVar10;
          }
          if (iVar9 == 0) {
            if (pIndex != (mz_uint32 *)0x0) {
              *pIndex = uVar3;
              return 1;
            }
            return 1;
          }
          lVar8 = uVar17 - 1;
          if (iVar9 < 0) {
            lVar18 = uVar17 + 1;
            lVar8 = lVar24;
          }
          lVar24 = lVar8;
        } while (lVar18 <= lVar24);
      }
      pZip->m_last_error = MZ_ZIP_FILE_NOT_FOUND;
      return 0;
    }
    sVar10 = strlen(pName);
    if (0xffff < sVar10) goto LAB_00107a31;
  }
  else {
    sVar10 = strlen(pName);
    if (0xffff < sVar10) goto LAB_00107a31;
    if (pComment != (char *)0x0) {
      local_78 = strlen(pComment);
      if (0xffff < local_78) {
        pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
        return 0;
      }
      goto LAB_00107bd1;
    }
  }
  local_78 = 0;
LAB_00107bd1:
  uVar3 = pZip->m_total_files;
  if ((ulong)uVar3 != 0) {
    pvVar5 = (pmVar4->m_central_dir).m_p;
    pvVar6 = (pmVar4->m_central_dir_offsets).m_p;
    uVar17 = 0;
    do {
      uVar25 = (ulong)*(uint *)((long)pvVar6 + uVar17 * 4);
      uVar2 = *(ushort *)((long)pvVar5 + uVar25 + 0x1c);
      uVar12 = (ulong)uVar2;
      if (sVar10 <= uVar12) {
        __s2 = (void *)((long)pvVar5 + uVar25 + 0x2e);
        if (local_78 == 0) goto LAB_00107cff;
        uVar11 = (ulong)*(ushort *)((long)pvVar5 + uVar25 + 0x20);
        if (local_78 != uVar11) goto LAB_00107ddf;
        uVar19 = (ulong)*(ushort *)((long)pvVar5 + uVar25 + 0x1e);
        if ((flags >> 8 & 1) == 0) {
          uVar15 = 0;
          do {
            bVar1 = pComment[uVar15];
            iVar9 = bVar1 + 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              iVar9 = (int)(char)bVar1;
            }
            bVar1 = *(byte *)((long)pvVar5 + uVar15 + uVar19 + uVar25 + uVar12 + 0x2e);
            iVar20 = bVar1 + 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              iVar20 = (int)(char)bVar1;
            }
            if (iVar9 != iVar20) goto LAB_00107ddf;
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
LAB_00107cff:
          if (((flags >> 9 & 1) != 0) && (uVar2 != 0)) {
            do {
              uVar14 = *(byte *)((long)pvVar5 + uVar12 + uVar25 + 0x2d) - 0x2f;
              if ((uVar14 < 0x2e) && ((0x200000000801U >> ((ulong)uVar14 & 0x3f) & 1) != 0))
              goto LAB_00107d40;
              bVar7 = 1 < (long)uVar12;
              uVar12 = uVar12 - 1;
            } while (bVar7);
            uVar12 = 0;
LAB_00107d40:
            __s2 = (void *)((long)__s2 + (uVar12 & 0xffffffff));
            uVar12 = (ulong)((uint)uVar2 - (int)uVar12);
          }
          if (sVar10 != uVar12) goto LAB_00107ddf;
          if ((flags >> 8 & 1) == 0) {
            if ((int)uVar12 != 0) {
              sVar13 = 0;
              do {
                bVar1 = pName[sVar13];
                iVar9 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  iVar9 = (int)(char)bVar1;
                }
                bVar1 = *(byte *)((long)__s2 + sVar13);
                iVar20 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  iVar20 = (int)(char)bVar1;
                }
                if (iVar9 != iVar20) goto LAB_00107ddf;
                sVar13 = sVar13 + 1;
              } while (sVar10 != sVar13);
            }
            bVar27 = false;
          }
          else {
            iVar9 = bcmp(pName,__s2,sVar10);
            bVar27 = iVar9 != 0;
          }
          bVar7 = (bool)(bVar27 ^ 1);
          if ((pIndex != (mz_uint32 *)0x0) && (!bVar27)) {
            *pIndex = (mz_uint32)uVar17;
            return 1;
          }
        }
        else {
          iVar9 = bcmp(pComment,(void *)((long)__s2 + uVar12 + uVar19),local_78);
          bVar7 = false;
          if (iVar9 == 0) goto LAB_00107cff;
        }
        if (bVar7) {
          return 1;
        }
      }
LAB_00107ddf:
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar3);
  }
  pZip->m_last_error = MZ_ZIP_FILE_NOT_FOUND;
  return 0;
}

Assistant:

mz_bool mz_zip_reader_locate_file_v2(mz_zip_archive *pZip, const char *pName, const char *pComment, mz_uint flags, mz_uint32 *pIndex)
{
    mz_uint file_index;
    size_t name_len, comment_len;

    if (pIndex)
        *pIndex = 0;

    if ((!pZip) || (!pZip->m_pState) || (!pName))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* See if we can use a binary search */
    if (((pZip->m_pState->m_init_flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0) &&
        (pZip->m_zip_mode == MZ_ZIP_MODE_READING) &&
        ((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) && (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size))
    {
        return mz_zip_locate_file_binary_search(pZip, pName, pIndex);
    }

    /* Locate the entry by scanning the entire central directory */
    name_len = strlen(pName);
    if (name_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    comment_len = pComment ? strlen(pComment) : 0;
    if (comment_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    for (file_index = 0; file_index < pZip->m_total_files; file_index++)
    {
        const mz_uint8 *pHeader = &MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir, mz_uint8, MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index));
        mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
        const char *pFilename = (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
        if (filename_len < name_len)
            continue;
        if (comment_len)
        {
            mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS), file_comment_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
            const char *pFile_comment = pFilename + filename_len + file_extra_len;
            if ((file_comment_len != comment_len) || (!mz_zip_string_equal(pComment, pFile_comment, file_comment_len, flags)))
                continue;
        }
        if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len))
        {
            int ofs = filename_len - 1;
            do
            {
                if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') || (pFilename[ofs] == ':'))
                    break;
            } while (--ofs >= 0);
            ofs++;
            pFilename += ofs;
            filename_len -= ofs;
        }
        if ((filename_len == name_len) && (mz_zip_string_equal(pName, pFilename, filename_len, flags)))
        {
            if (pIndex)
                *pIndex = file_index;
            return MZ_TRUE;
        }
    }

    return mz_zip_set_error(pZip, MZ_ZIP_FILE_NOT_FOUND);
}